

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O2

void __thiscall llvm::DWARFGdbIndex::dumpAddressArea(DWARFGdbIndex *this,raw_ostream *OS)

{
  raw_ostream *this_00;
  AddressEntry *Addr;
  long *plVar1;
  long lVar2;
  format_object_base local_60;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_50 = (ulong)(this->AddressArea).super_SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry>.
                    super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>.
                    super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>.
                    super_SmallVectorBase.Size;
  local_60.Fmt = "\n  Address area offset = 0x%x, has %ld entries:";
  local_60._vptr_format_object_base = (_func_int **)&PTR_home_01127d90;
  local_48 = CONCAT44(local_48._4_4_,this->AddressAreaOffset);
  this_00 = raw_ostream::operator<<(OS,&local_60);
  raw_ostream::operator<<(this_00,'\n');
  plVar1 = (long *)(this->AddressArea).super_SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry>.
                   super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>.
                   super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>.
                   super_SmallVectorBase.BeginX;
  for (lVar2 = (ulong)(this->AddressArea).super_SmallVectorImpl<llvm::DWARFGdbIndex::AddressEntry>.
                      super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::AddressEntry,_true>.
                      super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::AddressEntry,_void>.
                      super_SmallVectorBase.Size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    local_38 = *plVar1;
    local_40 = plVar1[1];
    local_48 = local_40 - local_38;
    local_60.Fmt = "    Low/High address = [0x%llx, 0x%llx) (Size: 0x%llx), CU id = %d\n";
    local_60._vptr_format_object_base = (_func_int **)&PTR_home_01128708;
    local_50 = CONCAT44(local_50._4_4_,(int)plVar1[2]);
    raw_ostream::operator<<(OS,&local_60);
    plVar1 = plVar1 + 3;
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpAddressArea(raw_ostream &OS) const {
  OS << format("\n  Address area offset = 0x%x, has %" PRId64 " entries:",
               AddressAreaOffset, (uint64_t)AddressArea.size())
     << '\n';
  for (const AddressEntry &Addr : AddressArea)
    OS << format(
        "    Low/High address = [0x%llx, 0x%llx) (Size: 0x%llx), CU id = %d\n",
        Addr.LowAddress, Addr.HighAddress, Addr.HighAddress - Addr.LowAddress,
        Addr.CuIndex);
}